

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toupper.c
# Opt level: O2

int main(void)

{
  _PDCLIB_lc_ctype_entry_t *p_Var1;
  
  p_Var1 = _PDCLIB_lc_ctype->entry;
  if (p_Var1[0x61].upper != 'A') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/toupper.c, line %d - %s\n"
           ,0x1a,"toupper( \'a\' ) == \'A\'");
    p_Var1 = _PDCLIB_lc_ctype->entry;
  }
  if (p_Var1[0x7a].upper != 'Z') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/toupper.c, line %d - %s\n"
           ,0x1b,"toupper( \'z\' ) == \'Z\'");
    p_Var1 = _PDCLIB_lc_ctype->entry;
  }
  if (p_Var1[0x41].upper != 'A') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/toupper.c, line %d - %s\n"
           ,0x1c,"toupper( \'A\' ) == \'A\'");
    p_Var1 = _PDCLIB_lc_ctype->entry;
  }
  if (p_Var1[0x5a].upper != 'Z') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/toupper.c, line %d - %s\n"
           ,0x1d,"toupper( \'Z\' ) == \'Z\'");
    p_Var1 = _PDCLIB_lc_ctype->entry;
  }
  if (p_Var1[0x40].upper != '@') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/toupper.c, line %d - %s\n"
           ,0x1e,"toupper( \'@\' ) == \'@\'");
    p_Var1 = _PDCLIB_lc_ctype->entry;
  }
  if (p_Var1[0x5b].upper != '[') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/toupper.c, line %d - %s\n"
           ,0x1f,"toupper( \'[\' ) == \'[\'");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    TESTCASE( toupper( 'a' ) == 'A' );
    TESTCASE( toupper( 'z' ) == 'Z' );
    TESTCASE( toupper( 'A' ) == 'A' );
    TESTCASE( toupper( 'Z' ) == 'Z' );
    TESTCASE( toupper( '@' ) == '@' );
    TESTCASE( toupper( '[' ) == '[' );
    return TEST_RESULTS;
}